

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O2

void __thiscall
xray_re::cse_alife_creature_actor::update_write(cse_alife_creature_actor *this,xr_packet *packet)

{
  cse_alife_creature_abstract::update_write(&this->super_cse_alife_creature_abstract,packet);
  (*packet->_vptr_xr_packet[8])(packet,(ulong)*(ushort *)&(this->super_cse_ph_skeleton).field_0x2c);
  xr_packet::w_sdir(packet,&this->m_accel);
  xr_packet::w_sdir(packet,&this->m_velocity);
  (*packet->_vptr_xr_packet[0xd])(this->m_radiation,packet);
  (*packet->_vptr_xr_packet[10])(packet,(ulong)this->m_weapon);
  (*packet->_vptr_xr_packet[8])(packet,(ulong)this->m_num_items);
  if (this->m_num_items == 0) {
    return;
  }
  __assert_fail("m_num_items == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity.cxx"
                ,0x63e,"virtual void xray_re::cse_alife_creature_actor::update_write(xr_packet &)");
}

Assistant:

void cse_alife_creature_actor::update_write(xr_packet& packet)
{
	cse_alife_creature_abstract::update_write(packet);
	packet.w_u16(m_state);
	packet.w_sdir(m_accel);
	packet.w_sdir(m_velocity);
	packet.w_float(m_radiation);
	packet.w_u8(m_weapon);
	packet.w_u16(m_num_items);
	xr_assert(m_num_items == 0);
}